

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O3

void * Node_InheritedVMT(node *p,fourcc_t ClassId)

{
  fourcc_t *pfVar1;
  long lVar2;
  
  lVar2 = (long)p->VMT + -0x48;
  do {
    pfVar1 = (fourcc_t *)(lVar2 + 0x50);
    lVar2 = *(long *)(lVar2 + 0x18);
    if (*pfVar1 == ClassId) {
      if (lVar2 != 0) {
        return (void *)(lVar2 + 0x48);
      }
      __assert_fail("Class->ParentClass",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                    ,0xafb,"const void *Node_InheritedVMT(node *, fourcc_t)");
    }
  } while (lVar2 != 0);
  __assert_fail("Class->ParentClass",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                ,0xaf8,"const void *Node_InheritedVMT(node *, fourcc_t)");
}

Assistant:

const void* Node_InheritedVMT(node* p,fourcc_t ClassId)
{
    const nodeclass* Class = NodeGetClass(p);
    while (NodeClass_ClassId(Class) != ClassId)
    {
        assert(Class->ParentClass);
        Class=Class->ParentClass;
    }
    assert(Class->ParentClass);
    return Class->ParentClass+1;
}